

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intrusive_list_column.h
# Opt level: O0

void __thiscall
Gudhi::persistence_matrix::
Intrusive_list_column<Column_mini_matrix<Chain_col_options<false,(Gudhi::persistence_matrix::Column_types)7,true,false,true>>>
::
Intrusive_list_column<std::vector<std::pair<unsigned_int,unsigned_int>,std::allocator<std::pair<unsigned_int,unsigned_int>>>,std::vector<boost::intrusive::list<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<false,(Gudhi::persistence_matrix::Column_types)7,true,false,true>>>,boost::intrusive::constant_time_size<false>,boost::intrusive::base_hook<boost::intrusive::list_base_hook<boost::intrusive::tag<Column_mini_matrix<Chain_col_options<false,(Gudhi::persistence_matrix::Column_types)7,true,false,true>>::Matrix_row_tag>,boost::intrusive::link_mode<(boost::intrusive::link_mode_type)2>>>>,std::allocator<boost::intrusive::list<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<false,(Gudhi::persistence_matrix::Column_types)7,true,false,true>>>,boost::intrusive::constant_time_size<false>,boost::intrusive::base_hook<boost::intrusive::list_base_hook<boost::intrusive::tag<Column_mini_matrix<Chain_col_options<false,(Gudhi::persistence_matrix::Column_types)7,true,false,true>>::Matrix_row_tag>,boost::intrusive::link_mode<(boost::intrusive::link_mode_type)2>>>>>>>
          (Intrusive_list_column<Column_mini_matrix<Chain_col_options<false,(Gudhi::persistence_matrix::Column_types)7,true,false,true>>>
           *this,Index columnIndex,
          vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
          *nonZeroRowIndices,Dimension dimension,
          vector<boost::intrusive::list<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<false,_(Gudhi::persistence_matrix::Column_types)7,_true,_false,_true>_>_>,_boost::intrusive::constant_time_size<false>,_boost::intrusive::base_hook<boost::intrusive::list_base_hook<boost::intrusive::tag<Column_mini_matrix<Chain_col_options<false,_(Gudhi::persistence_matrix::Column_types)7,_true,_false,_true>_>::Matrix_row_tag>,_boost::intrusive::link_mode<(boost::intrusive::link_mode_type)2>_>_>_>,_std::allocator<boost::intrusive::list<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<false,_(Gudhi::persistence_matrix::Column_types)7,_true,_false,_true>_>_>,_boost::intrusive::constant_time_size<false>,_boost::intrusive::base_hook<boost::intrusive::list_base_hook<boost::intrusive::tag<Column_mini_matrix<Chain_col_options<false,_(Gudhi::persistence_matrix::Column_types)7,_true,_false,_true>_>::Matrix_row_tag>,_boost::intrusive::link_mode<(boost::intrusive::link_mode_type)2>_>_>_>_>_>
          *rowContainer,Column_settings *colSettings)

{
  ID_index rowIndex;
  vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
  *this_00;
  bool bVar1;
  uint pivot;
  list_impl<boost::intrusive::bhtraits<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<false,_(Gudhi::persistence_matrix::Column_types)7,_true,_false,_true>_>_>,_boost::intrusive::list_node_traits<void_*>,_(boost::intrusive::link_mode_type)1,_Column_mini_matrix<Chain_col_options<false,_(Gudhi::persistence_matrix::Column_types)7,_true,_false,_true>_>::Matrix_column_tag,_1U>,_unsigned_long,_false,_void>
  local_80;
  Element local_64;
  reference local_60;
  pair<unsigned_int,_unsigned_int> *p;
  const_iterator __end0;
  const_iterator __begin0;
  vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
  *__range4;
  Column_settings *local_38;
  Column_settings *colSettings_local;
  vector<boost::intrusive::list<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<false,_(Gudhi::persistence_matrix::Column_types)7,_true,_false,_true>_>_>,_boost::intrusive::constant_time_size<false>,_boost::intrusive::base_hook<boost::intrusive::list_base_hook<boost::intrusive::tag<Column_mini_matrix<Chain_col_options<false,_(Gudhi::persistence_matrix::Column_types)7,_true,_false,_true>_>::Matrix_row_tag>,_boost::intrusive::link_mode<(boost::intrusive::link_mode_type)2>_>_>_>,_std::allocator<boost::intrusive::list<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<false,_(Gudhi::persistence_matrix::Column_types)7,_true,_false,_true>_>_>,_boost::intrusive::constant_time_size<false>,_boost::intrusive::base_hook<boost::intrusive::list_base_hook<boost::intrusive::tag<Column_mini_matrix<Chain_col_options<false,_(Gudhi::persistence_matrix::Column_types)7,_true,_false,_true>_>::Matrix_row_tag>,_boost::intrusive::link_mode<(boost::intrusive::link_mode_type)2>_>_>_>_>_>
  *rowContainer_local;
  vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
  *pvStack_20;
  Dimension dimension_local;
  vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
  *nonZeroRowIndices_local;
  Intrusive_list_column<Column_mini_matrix<Chain_col_options<false,(Gudhi::persistence_matrix::Column_types)7,true,false,true>>>
  *pIStack_10;
  Index columnIndex_local;
  Intrusive_list_column<Column_mini_matrix<Chain_col_options<false,_(Gudhi::persistence_matrix::Column_types)7,_true,_false,_true>_>_>
  *this_local;
  
  local_38 = colSettings;
  colSettings_local = (Column_settings *)rowContainer;
  rowContainer_local._4_4_ = dimension;
  pvStack_20 = nonZeroRowIndices;
  nonZeroRowIndices_local._4_4_ = columnIndex;
  pIStack_10 = this;
  Row_access<Column_mini_matrix<Chain_col_options<false,_(Gudhi::persistence_matrix::Column_types)7,_true,_false,_true>_>_>
  ::Row_access((Row_access<Column_mini_matrix<Chain_col_options<false,_(Gudhi::persistence_matrix::Column_types)7,_true,_false,_true>_>_>
                *)this,columnIndex,rowContainer);
  Column_dimension_holder<Column_mini_matrix<Chain_col_options<false,_(Gudhi::persistence_matrix::Column_types)7,_true,_false,_true>_>_>
  ::Column_dimension_holder
            ((Column_dimension_holder<Column_mini_matrix<Chain_col_options<false,_(Gudhi::persistence_matrix::Column_types)7,_true,_false,_true>_>_>
              *)(this + 0x10),rowContainer_local._4_4_);
  __range4 = pvStack_20;
  pivot = Intrusive_list_column<Column_mini_matrix<Chain_col_options<false,_(Gudhi::persistence_matrix::Column_types)7,_true,_false,_true>_>_>
          ::
          Intrusive_list_column<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>,_std::vector<boost::intrusive::list<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<false,_(Gudhi::persistence_matrix::Column_types)7,_true,_false,_true>_>_>,_boost::intrusive::constant_time_size<false>,_boost::intrusive::base_hook<boost::intrusive::list_base_hook<boost::intrusive::tag<Column_mini_matrix<Chain_col_options<false,_(Gudhi::persistence_matrix::Column_types)7,_true,_false,_true>_>::Matrix_row_tag>,_boost::intrusive::link_mode<(boost::intrusive::link_mode_type)2>_>_>_>,_std::allocator<boost::intrusive::list<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<false,_(Gudhi::persistence_matrix::Column_types)7,_true,_false,_true>_>_>,_boost::intrusive::constant_time_size<false>,_boost::intrusive::base_hook<boost::intrusive::list_base_hook<boost::intrusive::tag<Column_mini_matrix<Chain_col_options<false,_(Gudhi::persistence_matrix::Column_types)7,_true,_false,_true>_>::Matrix_row_tag>,_boost::intrusive::link_mode<(boost::intrusive::link_mode_type)2>_>_>_>_>_>_>
          ::anon_class_8_1_c18eeb02::operator()((anon_class_8_1_c18eeb02 *)&__range4);
  Chain_column_extra_properties<Column_mini_matrix<Chain_col_options<false,_(Gudhi::persistence_matrix::Column_types)7,_true,_false,_true>_>_>
  ::Chain_column_extra_properties
            ((Chain_column_extra_properties<Column_mini_matrix<Chain_col_options<false,_(Gudhi::persistence_matrix::Column_types)7,_true,_false,_true>_>_>
              *)(this + 0x14),pivot);
  *(undefined8 *)(this + 0x20) = 0;
  *(undefined1 **)(this + 0x28) = &local_38->field_0x20;
  boost::intrusive::
  list<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<false,_(Gudhi::persistence_matrix::Column_types)7,_true,_false,_true>_>_>,_boost::intrusive::constant_time_size<false>,_boost::intrusive::base_hook<boost::intrusive::list_base_hook<boost::intrusive::tag<Column_mini_matrix<Chain_col_options<false,_(Gudhi::persistence_matrix::Column_types)7,_true,_false,_true>_>::Matrix_column_tag>,_boost::intrusive::link_mode<(boost::intrusive::link_mode_type)1>_>_>_>
  ::list((list<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<false,_(Gudhi::persistence_matrix::Column_types)7,_true,_false,_true>_>_>,_boost::intrusive::constant_time_size<false>,_boost::intrusive::base_hook<boost::intrusive::list_base_hook<boost::intrusive::tag<Column_mini_matrix<Chain_col_options<false,_(Gudhi::persistence_matrix::Column_types)7,_true,_false,_true>_>::Matrix_column_tag>,_boost::intrusive::link_mode<(boost::intrusive::link_mode_type)1>_>_>_>
          *)(this + 0x30));
  this_00 = pvStack_20;
  *(Column_settings **)(this + 0x20) = local_38;
  __end0 = std::
           vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
           ::begin(pvStack_20);
  p = (pair<unsigned_int,_unsigned_int> *)
      std::
      vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
      ::end(this_00);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end0,(__normal_iterator<const_std::pair<unsigned_int,_unsigned_int>_*,_std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>_>
                                *)&p);
    if (!bVar1) break;
    local_60 = __gnu_cxx::
               __normal_iterator<const_std::pair<unsigned_int,_unsigned_int>_*,_std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>_>
               ::operator*(&__end0);
    local_64 = persistence_fields::Zp_field_operators<unsigned_int,_void>::get_value
                         (*(Zp_field_operators<unsigned_int,_void> **)(this + 0x20),local_60->second
                         );
    rowIndex = local_60->first;
    boost::intrusive::
    list_impl<boost::intrusive::bhtraits<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<false,_(Gudhi::persistence_matrix::Column_types)7,_true,_false,_true>_>_>,_boost::intrusive::list_node_traits<void_*>,_(boost::intrusive::link_mode_type)1,_Column_mini_matrix<Chain_col_options<false,_(Gudhi::persistence_matrix::Column_types)7,_true,_false,_true>_>::Matrix_column_tag,_1U>,_unsigned_long,_false,_void>
    ::end(&local_80);
    Intrusive_list_column<Column_mini_matrix<Chain_col_options<false,_(Gudhi::persistence_matrix::Column_types)7,_true,_false,_true>_>_>
    ::_insert_entry((Intrusive_list_column<Column_mini_matrix<Chain_col_options<false,_(Gudhi::persistence_matrix::Column_types)7,_true,_false,_true>_>_>
                     *)this,&local_64,rowIndex,(iterator *)&local_80);
    __gnu_cxx::
    __normal_iterator<const_std::pair<unsigned_int,_unsigned_int>_*,_std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>_>
    ::operator++(&__end0);
  }
  return;
}

Assistant:

inline Intrusive_list_column<Master_matrix>::Intrusive_list_column(Index columnIndex,
                                                                   const Container& nonZeroRowIndices,
                                                                   Dimension dimension,
                                                                   Row_container* rowContainer,
                                                                   Column_settings* colSettings)
    : RA_opt(columnIndex, rowContainer),
      Dim_opt(dimension),
      Chain_opt([&] {
        if constexpr (Master_matrix::Option_list::is_z2) {
          return nonZeroRowIndices.begin() == nonZeroRowIndices.end()
                     ? Master_matrix::template get_null_value<ID_index>()
                     : *std::prev(nonZeroRowIndices.end());
        } else {
          return nonZeroRowIndices.begin() == nonZeroRowIndices.end()
                     ? Master_matrix::template get_null_value<ID_index>()
                     : std::prev(nonZeroRowIndices.end())->first;
        }
      }()),
      operators_(nullptr),
      entryPool_(&(colSettings->entryConstructor)),
      column_()
{
  if constexpr (Master_matrix::Option_list::is_z2) {
    for (ID_index id : nonZeroRowIndices) {
      _insert_entry(id, column_.end());
    }
  } else {
    operators_ = &(colSettings->operators);
    for (const auto& p : nonZeroRowIndices) {
      _insert_entry(operators_->get_value(p.second), p.first, column_.end());
    }
  }
}